

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadTuple.h
# Opt level: O0

void __thiscall QuadTuple::printWithAct(QuadTuple *this,ofstream *out)

{
  _Setw _Var1;
  ostream *poVar2;
  ofstream *out_local;
  QuadTuple *this_local;
  
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)out,_Var1);
  poVar2 = std::operator<<(poVar2,(string *)this);
  _Var1 = std::setw(8);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,(string *)&this->name1);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(this->name1Act & 1));
  poVar2 = std::operator<<(poVar2,")");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,(string *)&this->name2);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(this->name2Act & 1));
  poVar2 = std::operator<<(poVar2,")");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,(string *)&this->res);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(this->resAct & 1));
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printWithAct(ofstream& out) {
        out << setw(8) << op << setw(8) << name1 << "(" << name1Act  << ")" << setw(8) << name2 << "(" << name2Act  << ")"
        << setw(8) << res << "(" << resAct  << ")" << endl;
    }